

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

Bool IsFilePath(ctmbstr path)

{
  char cVar1;
  char *p;
  char *pcVar2;
  char cVar3;
  
  cVar1 = *path;
  if (cVar1 == '\0') {
    cVar3 = '\0';
  }
  else {
    pcVar2 = path + 1;
    cVar3 = '\0';
    do {
      if (cVar3 == '\x02') {
        cVar3 = (cVar1 != '/') * '\x02' + '\x01';
      }
      else if (cVar3 == '\x01') {
        cVar3 = (cVar1 == '/') + '\x01';
      }
      else if (cVar3 == '\0') {
        cVar3 = cVar1 == ':';
      }
      cVar1 = *pcVar2;
    } while ((cVar1 != '\0') && (pcVar2 = pcVar2 + 1, cVar3 != '\x03'));
  }
  return (Bool)(cVar3 == '\0' || cVar3 == '\x03');
}

Assistant:

static Bool IsFilePath( ctmbstr path )
{
    const char *p = path;
    char c;
    typedef enum states { initial, protocol_found, slash_found, file_found } states;
    states state = initial;

    while ( ( c = *p++ ) != 0 && state != file_found )
    {
        switch ( state )
        {
            case initial:
                if ( c == ':' )
                    state = protocol_found;
                break;

            case protocol_found:
                if ( c =='/' )
                    state = slash_found;
                break;

            case slash_found:
                if ( c =='/' )
                    state = protocol_found;
                else
                    state = file_found;
                break;
                
            default:
                break;
        }
        
    }
    
    return state == file_found || state == initial;
}